

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O0

int inplace_text_resetter_proc(Am_Object *self)

{
  Am_Value *this;
  void *value;
  Am_Value *pAVar1;
  Am_String local_28;
  Am_String string;
  Am_Text_Info *text_info;
  Am_Object *self_local;
  
  this = (Am_Value *)Am_Object::Get((ushort)self,(ulong)Am_INPLACE_TEXT_INFO);
  value = Am_Value::operator_cast_to_void_(this);
  string.data = (Am_String_Data *)Am_Text_Info::Narrow(value);
  if (string.data != (Am_String_Data *)0x0) {
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)self,0xab);
    Am_String::Am_String(&local_28,pAVar1);
    (**(code **)(*(long *)string.data + 0x10))(string.data,&local_28);
    Am_String::~Am_String(&local_28);
  }
  return 0;
}

Assistant:

Am_Define_Formula(int, inplace_text_resetter)
{
  Am_Text_Info *text_info =
      Am_Text_Info::Narrow((Am_Ptr)self.Get(Am_INPLACE_TEXT_INFO));

  if (!text_info)
    return 0;

  Am_String string = self.Get(Am_TEXT);
  text_info->Set_Text(string);
  return 0;
}